

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O0

shared_ptr<const_rcg::Image> __thiscall
rcg::ImageList::find(ImageList *this,uint64_t timestamp,uint64_t tolerance)

{
  size_type sVar1;
  element_type *peVar2;
  uint64_t uVar3;
  shared_ptr<const_rcg::Image> *psVar4;
  ulong in_RCX;
  uint64_t in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<const_rcg::Image> sVar6;
  uint64_t ad;
  size_t i;
  uint64_t min_ad;
  size_t min_i;
  shared_ptr<const_rcg::Image> *in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffc0;
  ImageList *in_stack_ffffffffffffffc8;
  shared_ptr<const_rcg::Image> *this_00;
  shared_ptr<const_rcg::Image> *__n;
  ulong local_30;
  shared_ptr<const_rcg::Image> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  sVar1 = std::
          vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
          ::size((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                  *)(in_RSI + 8));
  if (sVar1 != 0) {
    if (in_RCX == 0) {
      sVar6 = find(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      _Var5 = sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_00137865;
    }
    local_28 = (shared_ptr<const_rcg::Image> *)0x0;
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                *)(in_RSI + 8),0);
    peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137761);
    uVar3 = Image::getTimestampNS(peVar2);
    local_30 = anon_unknown_3::absDiff(uVar3,in_RDX);
    this_00 = (shared_ptr<const_rcg::Image> *)0x1;
    while (__n = this_00,
          psVar4 = (shared_ptr<const_rcg::Image> *)
                   std::
                   vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                   ::size((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                           *)(in_RSI + 8)), this_00 < psVar4) {
      std::
      vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ::operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                    *)(in_RSI + 8),(size_type)__n);
      peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1377c4);
      uVar3 = Image::getTimestampNS(peVar2);
      uVar3 = anon_unknown_3::absDiff(uVar3,in_RDX);
      if (uVar3 < local_30) {
        local_30 = uVar3;
        local_28 = __n;
      }
      this_00 = (shared_ptr<const_rcg::Image> *)
                ((long)&(__n->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr + 1);
    }
    if (local_30 < in_RCX) {
      std::
      vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ::operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                    *)(in_RSI + 8),(size_type)local_28);
      std::shared_ptr<const_rcg::Image>::shared_ptr(this_00,in_stack_ffffffffffffff98);
      _Var5._M_pi = extraout_RDX;
      goto LAB_00137865;
    }
  }
  std::shared_ptr<const_rcg::Image>::shared_ptr((shared_ptr<const_rcg::Image> *)0x137865);
  _Var5._M_pi = extraout_RDX_00;
LAB_00137865:
  sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<const_rcg::Image>)
         sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp, uint64_t tolerance) const
{
  if (list.size() > 0)
  {
    if (tolerance > 0)
    {
      size_t min_i=0;
      uint64_t min_ad=absDiff(list[0]->getTimestampNS(), timestamp);

      for (size_t i=1; i<list.size(); i++)
      {
        uint64_t ad=absDiff(list[i]->getTimestampNS(), timestamp);

        if (ad < min_ad)
        {
          min_i=i;
          min_ad=ad;
        }
      }

      if (min_ad < tolerance)
      {
        return list[min_i];
      }
    }
    else
    {
      return find(timestamp);
    }
  }

  return std::shared_ptr<const Image>();
}